

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_utils.c
# Opt level: O2

int mk_utils_worker_rename(char *title)

{
  int iVar1;
  
  iVar1 = prctl(0xf,title,0,0,0);
  return iVar1;
}

Assistant:

int mk_utils_worker_rename(const char *title)
{
#if defined (__linux__)
    return prctl(PR_SET_NAME, title, 0, 0, 0);
#elif defined (__APPLE__)
    return pthread_setname_np(title);
#else
    (void) title;
    return -1;
#endif
}